

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonOom(JsonString *p)

{
  JsonString *p_local;
  
  p->bErr = '\x01';
  sqlite3_result_error_nomem(p->pCtx);
  jsonReset(p);
  return;
}

Assistant:

static void jsonOom(JsonString *p){
  p->bErr = 1;
  sqlite3_result_error_nomem(p->pCtx);
  jsonReset(p);
}